

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O1

void vkt::texture::anon_unknown_0::getAffineTexCoord2D
               (vector<float,_std::allocator<float>_> *dst,int cellNdx)

{
  pointer pfVar1;
  float *pfVar2;
  long lVar3;
  int col;
  long lVar4;
  tcu *ptVar5;
  bool bVar6;
  float v;
  float fVar7;
  undefined4 uVar8;
  Vec2 p3;
  Vec2 p2;
  Vec2 p1;
  Vec2 p0;
  Mat2 rotMatrix;
  Mat2 transform;
  Mat2 shearMatrix;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  float local_68 [4];
  Matrix<float,_2,_2> local_58;
  undefined8 local_40;
  tcu local_38 [16];
  Matrix<float,_2,_2> local_28;
  
  getBasicTexCoord2D(dst,cellNdx);
  pfVar2 = (float *)&local_58;
  local_58.m_data.m_data[0].m_data[0] = 0.0;
  local_58.m_data.m_data[0].m_data[1] = 0.0;
  local_58.m_data.m_data[1].m_data[0] = 0.0;
  local_58.m_data.m_data[1].m_data[1] = 0.0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar3 != lVar4) {
        uVar8 = 0;
      }
      pfVar2[lVar4 * 2] = (float)uVar8;
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    pfVar2 = pfVar2 + 1;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  local_68[2] = (float)cellNdx * 0.0625 * 6.2831855;
  local_68[3] = cosf(local_68[2]);
  local_58.m_data.m_data[0].m_data[1] = sinf(local_68[2]);
  local_58.m_data.m_data[0].m_data[0] = local_68[3];
  local_58.m_data.m_data[1].m_data =
       (float  [2])(CONCAT44(local_68[3],local_58.m_data.m_data[0].m_data[1]) ^ 0x80000000);
  local_28.m_data.m_data[1].m_data[0] = (float)(0xf - cellNdx) * 0.0625;
  pfVar2 = (float *)&local_28;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar3 != lVar4) {
        uVar8 = 0;
      }
      pfVar2[lVar4 * 2] = (float)uVar8;
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    pfVar2 = pfVar2 + 1;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  if (7 < cellNdx - 4U) {
    local_28.m_data.m_data[1].m_data[0] = 0.0;
  }
  local_28.m_data.m_data[0].m_data[0] = 1.0;
  local_28.m_data.m_data[0].m_data[1] = 0.0;
  local_28.m_data.m_data[1].m_data[1] = local_28.m_data.m_data[1].m_data[0] * 0.0 + 1.0;
  ptVar5 = local_38;
  tcu::operator*(ptVar5,&local_58,&local_28);
  pfVar1 = (dst->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_70 = *(undefined8 *)pfVar1;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  lVar3 = 0;
  do {
    fVar7 = 0.0;
    lVar4 = 0;
    do {
      fVar7 = fVar7 + *(float *)(ptVar5 + lVar4 * 8) * *(float *)((long)&local_70 + lVar4 * 4);
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    local_68[lVar3] = fVar7;
    ptVar5 = ptVar5 + 4;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  local_78 = *(undefined8 *)(pfVar1 + 2);
  local_70 = 0;
  ptVar5 = local_38;
  lVar3 = 0;
  do {
    fVar7 = 0.0;
    lVar4 = 0;
    do {
      fVar7 = fVar7 + *(float *)(ptVar5 + lVar4 * 8) * *(float *)((long)&local_78 + lVar4 * 4);
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    *(float *)((long)&local_70 + lVar3 * 4) = fVar7;
    ptVar5 = ptVar5 + 4;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  local_80 = *(undefined8 *)(pfVar1 + 4);
  local_78 = 0;
  ptVar5 = local_38;
  lVar3 = 0;
  do {
    fVar7 = 0.0;
    lVar4 = 0;
    do {
      fVar7 = fVar7 + *(float *)(ptVar5 + lVar4 * 8) * *(float *)((long)&local_80 + lVar4 * 4);
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    *(float *)((long)&local_78 + lVar3 * 4) = fVar7;
    ptVar5 = ptVar5 + 4;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  local_40 = *(undefined8 *)(pfVar1 + 6);
  local_80 = 0;
  ptVar5 = local_38;
  lVar3 = 0;
  do {
    fVar7 = 0.0;
    lVar4 = 0;
    do {
      fVar7 = fVar7 + *(float *)(ptVar5 + lVar4 * 8) * *(float *)(local_38 + lVar4 * 4 + -8);
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    *(float *)((long)&local_80 + lVar3 * 4) = fVar7;
    ptVar5 = ptVar5 + 4;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  *pfVar1 = local_68[0];
  pfVar1[1] = local_68[1];
  pfVar1[2] = (float)local_70;
  pfVar1[3] = local_70._4_4_;
  pfVar1[4] = (float)local_78;
  pfVar1[5] = local_78._4_4_;
  pfVar1[6] = (float)local_80;
  pfVar1[7] = local_80._4_4_;
  return;
}

Assistant:

static void getAffineTexCoord2D (std::vector<float>& dst, int cellNdx)
{
	// Use basic coords as base.
	getBasicTexCoord2D(dst, cellNdx);

	// Rotate based on cell index.
	const float		angle		= 2.0f*DE_PI * ((float)cellNdx / 16.0f);
	const tcu::Mat2	rotMatrix	= tcu::rotationMatrix(angle);

	// Second and third row are sheared.
	const float		shearX		= de::inRange(cellNdx, 4, 11) ? (float)(15-cellNdx) / 16.0f : 0.0f;
	const tcu::Mat2	shearMatrix	= tcu::shearMatrix(tcu::Vec2(shearX, 0.0f));

	const tcu::Mat2	transform	= rotMatrix * shearMatrix;
	const Vec2		p0			= transform * Vec2(dst[0], dst[1]);
	const Vec2		p1			= transform * Vec2(dst[2], dst[3]);
	const Vec2		p2			= transform * Vec2(dst[4], dst[5]);
	const Vec2		p3			= transform * Vec2(dst[6], dst[7]);

	dst[0] = p0.x();	dst[1] = p0.y();
	dst[2] = p1.x();	dst[3] = p1.y();
	dst[4] = p2.x();	dst[5] = p2.y();
	dst[6] = p3.x();	dst[7] = p3.y();
}